

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.hpp
# Opt level: O2

void __thiscall FunctionCallNode::~FunctionCallNode(FunctionCallNode *this)

{
  ~FunctionCallNode(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

FunctionCallNode(const std::string& name, 
    std::list<std::shared_ptr<ExpressionNode>> arguments):
      name_(name), arguments_(std::move(arguments)) {}